

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_DimensionPrinter>::ReadNumericExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_DimensionPrinter> *this,int opcode)

{
  Kind KVar1;
  CountExpr CVar2;
  int iVar3;
  ArgHandler *arg_handler;
  int iVar4;
  SymbolicArgHandler args_2;
  NumberOfArgHandler args_3;
  NumericArgHandler args;
  VarArgHandler args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_DimensionPrinter>::NumericExprReader>
  args_4;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
    ReadNumericExpr(this,false);
    goto LAB_0010c40f;
  case PLTERM:
    iVar3 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    if (iVar3 < 2) {
      TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x12cf1b);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    while( true ) {
      ReadConstant(this);
      if (iVar4 + -1 == 0) break;
      ReadConstant(this);
      iVar4 = iVar4 + -1;
    }
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_0010c3eb_caseD_29:
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x12cf43);
    break;
  case FIRST_ITERATED:
    iVar3 = ReadNumArgs(this,1);
    arg_handler = &args_1;
    goto LAB_0010c454;
  case SUM:
    iVar3 = ReadNumArgs(this,3);
    arg_handler = &args;
LAB_0010c454:
    NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter> *)this,iVar3,
               arg_handler);
    break;
  case LAST_ITERATED:
    iVar3 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadNumericExpr(this,false);
    NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter> *)this,iVar3 + -1,
               &args_3);
    break;
  case NUMBEROF_SYM:
    iVar3 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadSymbolicExpr(this);
    NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,DimensionPrinter> *)this,iVar3 + -1,
               &args_2);
    break;
  case COUNT:
    CVar2 = ReadCountExpr(this);
    return CVar2;
  default:
    if (KVar1 == ADD) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_DimensionPrinter>::NumericExprReader>
      ::BinaryArgReader(&args_4,this);
      return 0;
    }
    if (KVar1 != FIRST_UNARY) goto switchD_0010c3eb_caseD_29;
LAB_0010c40f:
    ReadNumericExpr(this,false);
  }
  return 0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}